

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

sector_t * P_PointInSectorBuggy(double x,double y)

{
  uint uVar1;
  node_t *pnVar2;
  subsector_t *psVar3;
  fixed_t x_1;
  fixed_t y_1;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  psVar3 = gamesubsectors;
  if ((long)numgamenodes != 0) {
    pnVar2 = gamenodes + (long)numgamenodes + -1;
    do {
      uVar6 = pnVar2->dx;
      iVar4 = SUB84(x + 103079215104.0,0);
      if (uVar6 == 0) {
        if (pnVar2->x < iVar4) {
          uVar6 = (uint)pnVar2->dy >> 0x1f;
        }
        else {
          uVar6 = (uint)(0 < pnVar2->dy);
        }
      }
      else {
        uVar1 = pnVar2->dy;
        iVar7 = SUB84(y + 103079215104.0,0);
        if (uVar1 == 0) {
          if (pnVar2->y < iVar7) {
            uVar6 = (uint)(0 < (int)uVar6);
          }
          else {
            uVar6 = uVar6 >> 0x1f;
          }
        }
        else {
          uVar5 = iVar4 - pnVar2->x;
          uVar8 = iVar7 - pnVar2->y;
          if ((int)(uVar1 ^ uVar6 ^ uVar5 ^ uVar8) < 0) {
            uVar6 = (uVar5 ^ uVar1) >> 0x1f;
          }
          else {
            uVar6 = (uint)((double)(int)uVar5 * (double)(int)uVar1 <=
                          (double)(int)uVar6 * (double)(int)uVar8);
          }
        }
      }
      pnVar2 = *(node_t **)((long)&pnVar2->field_6 + (ulong)uVar6 * 8);
    } while (((ulong)pnVar2 & 1) == 0);
    psVar3 = (subsector_t *)((long)&pnVar2[-1].field_6 + 0xf);
  }
  return (sector_t *)psVar3->sector;
}

Assistant:

sector_t *P_PointInSectorBuggy(double x, double y)
{
	// single subsector is a special case
	if (numgamenodes == 0)
		return gamesubsectors->sector;

	node_t *node = gamenodes + numgamenodes - 1;

	do
	{
		// Use original buggy point-on-side test when spawning
		// things at level load so that the map spots in the
		// emerald key room of Hexen MAP01 are spawned on the
		// window ledge instead of the blocking floor in front
		// of it. Why do I consider it buggy? Because a point
		// that lies directly on a line should always be
		// considered as "in front" of the line. The orientation
		// of the line should be irrelevant.
		node = (node_t *)node->children[R_PointOnSideSlow(x, y, node)];
	} while (!((size_t)node & 1));

	subsector_t *ssec = (subsector_t *)((BYTE *)node - 1);
	return ssec->sector;
}